

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O3

int __thiscall Ym2612_Impl::SLOT_SET(Ym2612_Impl *this,int Adr,int data)

{
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if ((Adr & 3U) == 3) {
    return 1;
  }
  uVar6 = (Adr & 0xf0U) - 0x30 >> 4;
  if (6 < uVar6) {
    return 0;
  }
  uVar5 = ((Adr << 0x17) >> 0x1f & 3U) + (Adr & 3U);
  uVar1 = (ulong)(((uint)Adr >> 2 & 3) * 0x90);
  switch(uVar6) {
  case 0:
    iVar4 = 1;
    if ((data & 0xfU) != 0) {
      iVar4 = (data & 0xfU) * 2;
    }
    *(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].MUL + uVar1) = iVar4;
    *(uint **)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].DT + uVar1) =
         (this->g).DT_TAB[0] + (ulong)(data & 0x70) * 2;
    (this->YM2612).CHANNEL[uVar5].SLOT[0].Finc = -1;
    return 0;
  case 1:
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].TL + uVar1) = data & 0x7fU;
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].TLL + uVar1) = (data & 0x7fU) << 5;
    return 0;
  case 2:
    *(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].KSR_S + uVar1) = 3 - (data >> 6);
    (this->YM2612).CHANNEL[uVar5].SLOT[0].Finc = -1;
    puVar2 = (this->g).AR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar2 = (this->g).NULL_RATE;
    }
    *(uint **)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].AR + uVar1) = puVar2;
    uVar6 = puVar2[*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].KSR + uVar1)];
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].EincA + uVar1) = uVar6;
    if (*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Ecurp + uVar1) != 0) {
      return 0;
    }
    goto LAB_006eae59;
  case 3:
    iVar4 = 0x1f;
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].AMSon + uVar1) = data & 0x80U;
    if ((data & 0x80U) != 0) {
      iVar4 = (this->YM2612).CHANNEL[uVar5].AMS;
    }
    *(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].AMS + uVar1) = iVar4;
    puVar2 = (this->g).DR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar2 = (this->g).NULL_RATE;
    }
    *(uint **)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].DR + uVar1) = puVar2;
    uVar6 = puVar2[*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].KSR + uVar1)];
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].EincD + uVar1) = uVar6;
    if (*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Ecurp + uVar1) != 1) {
      return 0;
    }
    goto LAB_006eae59;
  case 4:
    puVar2 = (this->g).DR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar2 = (this->g).NULL_RATE;
    }
    *(uint **)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].SR + uVar1) = puVar2;
    uVar6 = puVar2[*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].KSR + uVar1)];
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].EincS + uVar1) = uVar6;
    if (*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Ecurp + uVar1) != 2) {
      return 0;
    }
    break;
  case 5:
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].SLL + uVar1) =
         (this->g).SL_TAB[data >> 4];
    uVar3 = (ulong)((data & 0xfU) << 4 | 8);
    *(ulong *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].RR + uVar1) =
         (long)(this->g).DR_TAB + uVar3;
    uVar6 = *(uint *)((long)(this->g).DR_TAB +
                     (long)*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].KSR + uVar1) * 4 +
                     uVar3);
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].EincR + uVar1) = uVar6;
    if (*(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Ecurp + uVar1) != 3) {
      return 0;
    }
    break;
  case 6:
    uVar6 = (data << 0x1c) >> 0x1f & data;
    *(undefined8 *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].env_xor + uVar1) =
         0x7fffffff00000000;
    *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].SEG + uVar1) = uVar6 & 0xf;
    if ((uVar6 & 4) == 0) {
      return 0;
    }
    *(undefined8 *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].env_xor + uVar1) = 0xfff00000fff;
    return 0;
  }
  if (0x1fffffff < *(int *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Ecnt + uVar1)) {
    return 0;
  }
LAB_006eae59:
  *(uint *)((long)&(this->YM2612).CHANNEL[uVar5].SLOT[0].Einc + uVar1) = uVar6;
  return 0;
}

Assistant:

int Ym2612_Impl::SLOT_SET( int Adr, int data )
{
	int nch = Adr & 3;
	if ( nch == 3 )
		return 1;
	
	channel_t& ch = YM2612.CHANNEL [nch + (Adr & 0x100 ? 3 : 0)];
	slot_t& sl = ch.SLOT [(Adr >> 2) & 3];

	switch ( Adr & 0xF0 )
	{
		case 0x30:
			if ( (sl.MUL = (data & 0x0F)) != 0 ) sl.MUL <<= 1;
			else sl.MUL = 1;

			sl.DT = (int*) g.DT_TAB [(data >> 4) & 7];

			ch.SLOT [0].Finc = -1;

			break;

		case 0x40:
			sl.TL = data & 0x7F;

			// SOR2 do a lot of TL adjustement and this fix R.Shinobi jump sound...
			YM2612_Special_Update();

#if ((ENV_HBITS - 7) < 0)
			sl.TLL = sl.TL >> (7 - ENV_HBITS);
#else
			sl.TLL = sl.TL << (ENV_HBITS - 7);
#endif

			break;

		case 0x50:
			sl.KSR_S = 3 - (data >> 6);

			ch.SLOT [0].Finc = -1;

			if (data &= 0x1F) sl.AR = (int*) &g.AR_TAB [data << 1];
			else sl.AR = (int*) &g.NULL_RATE [0];

			sl.EincA = sl.AR [sl.KSR];
			if (sl.Ecurp == ATTACK) sl.Einc = sl.EincA;
			break;

		case 0x60:
			if ( (sl.AMSon = (data & 0x80)) != 0 ) sl.AMS = ch.AMS;
			else sl.AMS = 31;

			if (data &= 0x1F) sl.DR = (int*) &g.DR_TAB [data << 1];
			else sl.DR = (int*) &g.NULL_RATE [0];

			sl.EincD = sl.DR [sl.KSR];
			if (sl.Ecurp == DECAY) sl.Einc = sl.EincD;
			break;

		case 0x70:
			if (data &= 0x1F) sl.SR = (int*) &g.DR_TAB [data << 1];
			else sl.SR = (int*) &g.NULL_RATE [0];

			sl.EincS = sl.SR [sl.KSR];
			if ((sl.Ecurp == SUBSTAIN) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincS;
			break;

		case 0x80:
			sl.SLL = g.SL_TAB [data >> 4];

			sl.RR = (int*) &g.DR_TAB [((data & 0xF) << 2) + 2];

			sl.EincR = sl.RR [sl.KSR];
			if ((sl.Ecurp == RELEASE) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincR;
			break;

		case 0x90:
			// SSG-EG envelope shapes :
			/*
			   E  At Al H
			  
			   1  0  0  0  \\\\
			   1  0  0  1  \___
			   1  0  1  0  \/\/
			   1  0  1  1  \
			   1  1  0  0  ////
			   1  1  0  1  /
			   1  1  1  0  /\/\
			   1  1  1  1  /___
			  
			   E  = SSG-EG enable
			   At = Start negate
			   Al = Altern
			   H  = Hold */

			set_seg( sl, (data & 8) ? (data & 0x0F) : 0 );
			break;
	}

	return 0;
}